

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall kj::(anonymous_namespace)::AsyncPipe::BlockedRead::write(BlockedRead *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  anon_unknown_123::AsyncPipe::BlockedRead::write((BlockedRead *)this,in_ESI + -8,in_RDX,in_RCX);
  return;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");

      KJ_SWITCH_ONEOF(writeImpl(buffer, nullptr)) {
        KJ_CASE_ONEOF(done, Done) {
          return READY_NOW;
        }
        KJ_CASE_ONEOF(retry, Retry) {
          KJ_ASSERT(retry.moreData == nullptr);
          return pipe.write(retry.data);
        }
      }
      KJ_UNREACHABLE;
    }